

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

bam_mplp_t bam_mplp_init(int n,bam_plp_auto_f func,void **data)

{
  bam_mplp_t p_Var1;
  uint64_t *puVar2;
  int *piVar3;
  bam_pileup1_t **ppbVar4;
  bam_plp_t *pp_Var5;
  bam_plp_t p_Var6;
  bam_mplp_t iter;
  int i;
  void **data_local;
  bam_plp_auto_f func_local;
  int n_local;
  
  p_Var1 = (bam_mplp_t)calloc(1,0x30);
  puVar2 = (uint64_t *)calloc((long)n,8);
  p_Var1->pos = puVar2;
  piVar3 = (int *)calloc((long)n,4);
  p_Var1->n_plp = piVar3;
  ppbVar4 = (bam_pileup1_t **)calloc((long)n,8);
  p_Var1->plp = ppbVar4;
  pp_Var5 = (bam_plp_t *)calloc((long)n,8);
  p_Var1->iter = pp_Var5;
  p_Var1->n = n;
  p_Var1->min = 0xffffffffffffffff;
  for (iter._4_4_ = 0; iter._4_4_ < n; iter._4_4_ = iter._4_4_ + 1) {
    p_Var6 = bam_plp_init(func,data[iter._4_4_]);
    p_Var1->iter[iter._4_4_] = p_Var6;
    p_Var1->pos[iter._4_4_] = p_Var1->min;
  }
  return p_Var1;
}

Assistant:

bam_mplp_t bam_mplp_init(int n, bam_plp_auto_f func, void **data)
{
    int i;
    bam_mplp_t iter;
    iter = (bam_mplp_t)calloc(1, sizeof(struct __bam_mplp_t));
    iter->pos = (uint64_t*)calloc(n, sizeof(uint64_t));
    iter->n_plp = (int*)calloc(n, sizeof(int));
    iter->plp = (const bam_pileup1_t**)calloc(n, sizeof(bam_pileup1_t*));
    iter->iter = (bam_plp_t*)calloc(n, sizeof(bam_plp_t));
    iter->n = n;
    iter->min = (uint64_t)-1;
    for (i = 0; i < n; ++i) {
        iter->iter[i] = bam_plp_init(func, data[i]);
        iter->pos[i] = iter->min;
    }
    return iter;
}